

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_schema_entry.cpp
# Opt level: O1

void __thiscall duckdb::DuckSchemaEntry::Verify(DuckSchemaEntry *this,Catalog *catalog)

{
  InCatalogEntry::Verify((InCatalogEntry *)this,catalog);
  CatalogSet::Verify(&this->tables,catalog);
  CatalogSet::Verify(&this->indexes,catalog);
  CatalogSet::Verify(&this->table_functions,catalog);
  CatalogSet::Verify(&this->copy_functions,catalog);
  CatalogSet::Verify(&this->pragma_functions,catalog);
  CatalogSet::Verify(&this->functions,catalog);
  CatalogSet::Verify(&this->sequences,catalog);
  CatalogSet::Verify(&this->collations,catalog);
  CatalogSet::Verify(&this->types,catalog);
  return;
}

Assistant:

void DuckSchemaEntry::Verify(Catalog &catalog) {
	InCatalogEntry::Verify(catalog);

	tables.Verify(catalog);
	indexes.Verify(catalog);
	table_functions.Verify(catalog);
	copy_functions.Verify(catalog);
	pragma_functions.Verify(catalog);
	functions.Verify(catalog);
	sequences.Verify(catalog);
	collations.Verify(catalog);
	types.Verify(catalog);
}